

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

uint64_t load_memop(void *haddr,MemOp op)

{
  uint uVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  uVar3 = 0;
  switch(op) {
  case MO_8:
    return (ulong)*haddr;
  case MO_16:
    return (ulong)*haddr;
  case MO_32:
    return (ulong)*haddr;
  case MO_64:
    uVar3 = *haddr;
    break;
  case MO_BEUW:
    return (ulong)(ushort)(*haddr << 8 | *haddr >> 8);
  case MO_BEUL:
    uVar1 = *haddr;
    return (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  case MO_BEQ:
    uVar2 = *haddr;
    return uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  return uVar3;
}

Assistant:

static inline uint64_t
load_memop(const void *haddr, MemOp op)
{
    switch (op) {
    case MO_UB:
        return ldub_p(haddr);
    case MO_BEUW:
        return lduw_be_p(haddr);
    case MO_LEUW:
        return lduw_le_p(haddr);
    case MO_BEUL:
        return (uint32_t)ldl_be_p(haddr);
    case MO_LEUL:
        return (uint32_t)ldl_le_p(haddr);
    case MO_BEQ:
        return ldq_be_p(haddr);
    case MO_LEQ:
        return ldq_le_p(haddr);
    default:
        // qemu_build_not_reached();
        return 0;
    }
}